

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O3

bool absl::lts_20240722::str_format_internal::anon_unknown_53::ConvertIntImplInnerSlow
               (IntDigits *as_digits,FormatConversionSpecImpl conv,FormatSinkImpl *sink)

{
  char cVar1;
  uint uVar2;
  string_view v;
  size_t sVar3;
  undefined1 extraout_AL;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  char *pcVar7;
  size_t n;
  size_t sVar8;
  FormatSinkImpl *in_R8;
  char *pcVar9;
  char *pcVar10;
  ulong uVar11;
  char *pcVar12;
  ulong uVar13;
  size_t n_00;
  char *pcVar14;
  char *pcVar15;
  bool bVar16;
  string_view v_00;
  string_view v_01;
  
  uVar5 = conv.precision_;
  uVar11 = conv._0_8_;
  uVar2 = uVar5 >> 8;
  pcVar12 = (char *)0x0;
  pcVar9 = (char *)(register0x00000010 >> 0x20);
  if ((long)register0x00000010 < 0) {
    pcVar9 = pcVar12;
  }
  cVar1 = *(char *)&as_digits->start_;
  uVar6 = (ulong)(cVar1 < '1');
  pcVar15 = (char *)(uVar11 - uVar6);
  pcVar14 = pcVar9 + -(long)pcVar15;
  if (pcVar9 < pcVar15) {
    pcVar14 = pcVar12;
  }
  bVar16 = (uVar5 & 0xfe) == 2;
  pcVar9 = "-";
  if (!bVar16) {
    pcVar9 = pcVar12;
  }
  if (bVar16 && cVar1 != '-') {
    if ((uVar2 & 2) == 0) {
      pcVar9 = (char *)0x0;
      if ((uVar2 & 4) != 0) {
        pcVar9 = " ";
      }
      pcVar12 = (char *)(ulong)((conv.precision_._1_1_ & 4) >> 2);
    }
    else {
      pcVar12 = (char *)0x1;
      pcVar9 = "+";
    }
  }
  else {
    pcVar12 = (char *)(ulong)bVar16;
  }
  pcVar7 = (char *)0x0;
  pcVar10 = pcVar14 + -(long)pcVar12;
  if (pcVar14 < pcVar12) {
    pcVar10 = (char *)0x0;
  }
  bVar4 = (byte)conv.precision_;
  if (bVar4 < 0x12) {
    pcVar14 = (char *)0x0;
    pcVar7 = (char *)0x0;
    if ((0x200c0U >> (uVar5 & 0x1f) & 1) != 0) {
      pcVar7 = (char *)0x0;
      pcVar14 = (char *)0x0;
      if ((uVar5 >> 0xb & 1) != 0 || bVar4 == 0x11) {
        pcVar7 = (char *)0x0;
        pcVar14 = (char *)0x0;
        if (uVar11 != cVar1 < '1') {
          pcVar7 = "0x";
          if (bVar4 == 7) {
            pcVar7 = "0X";
          }
          pcVar14 = (char *)0x2;
        }
      }
    }
  }
  else {
    pcVar14 = (char *)0x0;
  }
  uVar13 = 0;
  if (pcVar14 <= pcVar10) {
    uVar13 = (long)pcVar10 - (long)pcVar14;
  }
  pcVar10 = (char *)0x1;
  if (-1 < (int)sink) {
    pcVar10 = (char *)((ulong)sink & 0xffffffff);
  }
  if ((bVar4 == 4 && (uVar2 & 8) != 0) &&
     (((uVar11 == uVar6 || (as_digits->storage_[uVar6 - 0x10] != '0')) && (pcVar10 < pcVar15 + 1))))
  {
    pcVar10 = pcVar15 + 1;
  }
  n = 0;
  uVar11 = (long)pcVar10 - (long)pcVar15;
  if (pcVar10 < pcVar15) {
    uVar11 = n;
  }
  n_00 = uVar13 - uVar11;
  if (uVar13 < uVar11) {
    n_00 = n;
  }
  if ((uVar2 & 1) == 0) {
    n = n_00;
  }
  if ((int)sink < 0) {
    sVar8 = n;
    sVar3 = 0;
    if ((uVar2 & 0x10) == 0) {
      sVar8 = 0;
      sVar3 = n;
    }
    n = sVar3;
    uVar11 = uVar11 + sVar8;
  }
  if ((uVar2 & 1) == 0) {
    n_00 = 0;
  }
  FormatSinkImpl::Append(in_R8,n,' ');
  v._M_str = pcVar9;
  v._M_len = (size_t)pcVar12;
  FormatSinkImpl::Append(in_R8,v);
  v_00._M_str = pcVar7;
  v_00._M_len = (size_t)pcVar14;
  FormatSinkImpl::Append(in_R8,v_00);
  FormatSinkImpl::Append(in_R8,uVar11,'0');
  v_01._M_str = as_digits->storage_ + (uVar6 - 0x10);
  v_01._M_len = (size_t)pcVar15;
  FormatSinkImpl::Append(in_R8,v_01);
  FormatSinkImpl::Append(in_R8,n_00,' ');
  return (bool)extraout_AL;
}

Assistant:

bool ConvertIntImplInnerSlow(const IntDigits &as_digits,
                             const FormatConversionSpecImpl conv,
                             FormatSinkImpl *sink) {
  // Print as a sequence of Substrings:
  //   [left_spaces][sign][base_indicator][zeroes][formatted][right_spaces]
  size_t fill = 0;
  if (conv.width() >= 0)
    fill = static_cast<size_t>(conv.width());

  string_view formatted = as_digits.without_neg_or_zero();
  ReducePadding(formatted, &fill);

  string_view sign = SignColumn(as_digits.is_negative(), conv);
  ReducePadding(sign, &fill);

  string_view base_indicator = BaseIndicator(as_digits, conv);
  ReducePadding(base_indicator, &fill);

  bool precision_specified = conv.precision() >= 0;
  size_t precision =
      precision_specified ? static_cast<size_t>(conv.precision()) : size_t{1};

  if (conv.has_alt_flag() &&
      conv.conversion_char() == FormatConversionCharInternal::o) {
    // From POSIX description of the '#' (alt) flag:
    //   "For o conversion, it increases the precision (if necessary) to
    //   force the first digit of the result to be zero."
    if (formatted.empty() || *formatted.begin() != '0') {
      size_t needed = formatted.size() + 1;
      precision = std::max(precision, needed);
    }
  }

  size_t num_zeroes = Excess(formatted.size(), precision);
  ReducePadding(num_zeroes, &fill);

  size_t num_left_spaces = !conv.has_left_flag() ? fill : 0;
  size_t num_right_spaces = conv.has_left_flag() ? fill : 0;

  // From POSIX description of the '0' (zero) flag:
  //   "For d, i, o, u, x, and X conversion specifiers, if a precision
  //   is specified, the '0' flag is ignored."
  if (!precision_specified && conv.has_zero_flag()) {
    num_zeroes += num_left_spaces;
    num_left_spaces = 0;
  }

  sink->Append(num_left_spaces, ' ');
  sink->Append(sign);
  sink->Append(base_indicator);
  sink->Append(num_zeroes, '0');
  sink->Append(formatted);
  sink->Append(num_right_spaces, ' ');
  return true;
}